

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

void __thiscall arm::Function::display(Function *this,ostream *o)

{
  string *psVar1;
  element_type *peVar2;
  pointer puVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  undefined **ppuVar6;
  Inst *pIVar7;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *i;
  pointer puVar8;
  
  for (p_Var5 = (this->local_const)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->local_const)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    poVar4 = std::operator<<(o,(string *)(p_Var5 + 1));
    poVar4 = std::operator<<(poVar4,":");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(o,"\t");
    (*(code *)**(undefined8 **)(p_Var5 + 2))(p_Var5 + 2,poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  poVar4 = std::operator<<(o,"\t.globl ");
  psVar1 = &this->name;
  poVar4 = std::operator<<(poVar4,(string *)psVar1);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(o,"\t@ ");
  poVar4 = std::operator<<(poVar4,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,": ");
  peVar2 = (this->ty).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(peVar2->super_Ty).super_Displayable._vptr_Displayable)(peVar2,poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(o,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,":");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(o,"\t.fnstart");
  std::endl<char,std::char_traits<char>>(poVar4);
  puVar3 = (this->inst).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (this->inst).
                super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar3; puVar8 = puVar8 + 1) {
    pIVar7 = (puVar8->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
             super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
             super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    if (pIVar7 == (Inst *)0x0) {
      poVar4 = std::operator<<(o,"!!!nullptr!!!");
    }
    else {
      ppuVar6 = &PTR_display_001db748;
      if ((pIVar7->super_Displayable)._vptr_Displayable != (_func_int **)&PTR_display_001db748) {
        std::operator<<(o,"\t");
        pIVar7 = (puVar8->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                 _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
        ppuVar6 = (pIVar7->super_Displayable)._vptr_Displayable;
      }
      (*(code *)*ppuVar6)(pIVar7,o);
      poVar4 = o;
    }
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  poVar4 = std::operator<<(o,"\t.fnend");
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void Function::display(std::ostream &o) const {
  for (auto &v : this->local_const) {
    o << v.first << ":" << std::endl;
    o << "\t" << v.second << std::endl;
  }

  o << "\t.globl " << name << std::endl;

  o << "\t@ " << name << ": " << *ty << std::endl;

  o << name << ":" << std::endl;
  // o << "\t.align 7" << std::endl;
  o << "\t.fnstart" << std::endl;
  for (auto &i : inst) {
    if (i == nullptr) {
      o << "!!!nullptr!!!" << std::endl;
      continue;
    } else if (dynamic_cast<LabelInst *>(&*i) == nullptr) {
      o << "\t";
    }
    o << *i << std::endl;
  }
  o << "\t.fnend" << std::endl;
}